

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.h
# Opt level: O2

void __thiscall
HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>::
Trace(HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
      *this,Visitor *visitor)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->map_)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    Visitor::Trace<LinkedNode>
              (visitor,(Member<LinkedNode> *)
                       *(_Hash_node_base **)
                        &((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor);
  }
  return;
}

Assistant:

void Trace(Visitor *visitor) const override {
    for (auto &pr : map_) {
      visitor->Trace(*pr.second);
    }
  }